

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O0

size_t ZSTD_compressBlock_lazy2_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  uint uVar1;
  BYTE *pBVar2;
  int iVar3;
  int iVar4;
  U32 UVar5;
  U32 UVar6;
  uint uVar7;
  BYTE *iEnd;
  BYTE *pBVar8;
  BYTE *iStart;
  size_t sVar9;
  BYTE *pBVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  BYTE *dst;
  bool bVar14;
  U32 local_538;
  U32 local_534;
  BYTE *local_528;
  BYTE *local_518;
  BYTE *local_508;
  BYTE *local_500;
  BYTE *local_4d8;
  BYTE *local_4c8;
  BYTE *local_498;
  BYTE *local_488;
  BYTE *local_468;
  BYTE *local_458;
  size_t srcSize_local;
  void *src_local;
  U32 *rep_local;
  seqStore_t *seqStore_local;
  ZSTD_matchState_t *ms_local;
  BYTE *repEnd2;
  BYTE *repMatch_3;
  U32 repIndex_3;
  U32 current2;
  size_t litLength;
  BYTE *mStart;
  BYTE *match;
  U32 matchIndex;
  int gain1_5;
  int gain2_5;
  size_t ml2_2;
  size_t offset2_1;
  int gain1_4;
  int gain2_4;
  size_t mlRep_3;
  BYTE *repMatchEnd_2;
  BYTE *repMatch_2;
  U32 repIndex_2;
  int gain1_3;
  int gain2_3;
  size_t mlRep_2;
  int gain1_2;
  int gain2_2;
  size_t ml2_1;
  size_t offset2;
  int gain1_1;
  int gain2_1;
  size_t mlRep_1;
  BYTE *repMatchEnd_1;
  BYTE *repMatch_1;
  U32 repIndex_1;
  int gain1;
  int gain2;
  size_t mlRep;
  size_t ml2;
  size_t offsetFound;
  BYTE *repMatchEnd;
  BYTE *repMatch;
  BYTE *pBStack_2e0;
  U32 repIndex;
  BYTE *start;
  size_t offset;
  size_t matchLength;
  U32 maxRep;
  U32 windowLow;
  U32 curr;
  U32 dictAndPrefixLength;
  U32 dictIndexDelta;
  BYTE *dictEnd;
  BYTE *dictLowest;
  BYTE *dictBase;
  ZSTD_matchState_t *pZStack_290;
  U32 dictLowestIndex;
  ZSTD_matchState_t *dms;
  int isDxS;
  int isDDS;
  int isDMS;
  U32 savedOffset;
  U32 offset_2;
  U32 offset_1;
  searchMax_f searchMax;
  searchMax_f searchFuncs [4] [3];
  U32 rowLog;
  BYTE *prefixLowest;
  U32 prefixLowestIndex;
  BYTE *base;
  BYTE *ilimit;
  BYTE *iend;
  BYTE *anchor;
  BYTE *ip;
  BYTE *istart;
  BYTE *litEnd_1;
  BYTE *litLimit_w_1;
  BYTE *litEnd_2;
  BYTE *litLimit_w_2;
  BYTE *litEnd;
  BYTE *litLimit_w;
  BYTE *oend;
  BYTE *op;
  BYTE *ip_1;
  ptrdiff_t diff;
  BYTE *oend_2;
  BYTE *op_2;
  BYTE *ip_3;
  ptrdiff_t diff_2;
  BYTE *oend_1;
  BYTE *op_1;
  BYTE *ip_2;
  ptrdiff_t diff_1;
  
  iEnd = (BYTE *)((long)src + srcSize);
  pBVar8 = iEnd + -8;
  pBVar2 = (ms->window).base;
  uVar1 = (ms->window).dictLimit;
  iStart = pBVar2 + uVar1;
  searchFuncs[3][2]._4_4_ = 5;
  if ((ms->cParams).searchLog < 5) {
    searchFuncs[3][2]._4_4_ = 4;
  }
  memcpy(&searchMax,&PTR_ZSTD_HcFindBestMatch_selectMLS_00fbca60,0x60);
  savedOffset = *rep;
  isDMS = rep[1];
  pZStack_290 = ms->dictMatchState;
  dictBase._4_4_ = (pZStack_290->window).dictLimit;
  dictLowest = (pZStack_290->window).base;
  dictEnd = dictLowest + dictBase._4_4_;
  _dictAndPrefixLength = (pZStack_290->window).nextSrc;
  curr = uVar1 - ((int)_dictAndPrefixLength - (int)dictLowest);
  windowLow = ((int)src - (int)iStart) + ((int)_dictAndPrefixLength - (int)dictEnd);
  anchor = (BYTE *)((long)src + (long)(int)(uint)(windowLow == 0));
  iVar3 = (int)pBVar2;
  _offset_2 = searchFuncs[1][2];
  isDDS = 0;
  isDxS = 1;
  dms._4_4_ = 0;
  dms._0_4_ = 1;
  iend = (BYTE *)src;
  do {
    while( true ) {
      if (pBVar8 <= anchor) {
        if (savedOffset == 0) {
          local_534 = isDDS;
        }
        else {
          local_534 = savedOffset;
        }
        *rep = local_534;
        if (isDMS == 0) {
          local_538 = isDDS;
        }
        else {
          local_538 = isDMS;
        }
        rep[1] = local_538;
        return (long)iEnd - (long)iend;
      }
      offset = 0;
      start = (BYTE *)0x0;
      pBStack_2e0 = anchor + 1;
      if ((int)dms != 0) {
        repMatch._4_4_ = (((int)anchor - iVar3) + 1) - savedOffset;
        if (repMatch._4_4_ < uVar1) {
          local_458 = dictLowest + (repMatch._4_4_ - curr);
        }
        else {
          local_458 = pBVar2 + repMatch._4_4_;
        }
        repMatchEnd = local_458;
        if (2 < (uVar1 - 1) - repMatch._4_4_) {
          UVar5 = MEM_read32(local_458);
          UVar6 = MEM_read32(anchor + 1);
          if (UVar5 == UVar6) {
            local_468 = iEnd;
            if (repMatch._4_4_ < uVar1) {
              local_468 = _dictAndPrefixLength;
            }
            offsetFound = (size_t)local_468;
            sVar9 = ZSTD_count_2segments(anchor + 5,repMatchEnd + 4,iEnd,local_468,iStart);
            offset = sVar9 + 4;
          }
        }
      }
      ml2 = 999999999;
      mlRep = (*_offset_2)(ms,anchor,iEnd,&ml2);
      if (offset < mlRep) {
        pBStack_2e0 = anchor;
        start = (BYTE *)ml2;
        offset = mlRep;
      }
      if (3 < offset) break;
      anchor = anchor + ((long)anchor - (long)iend >> 8) + 1;
    }
    while (anchor < pBVar8) {
      pBVar10 = anchor + 1;
      if ((int)dms != 0) {
        repMatch_1._4_4_ = ((int)pBVar10 - iVar3) - savedOffset;
        if (repMatch_1._4_4_ < uVar1) {
          local_488 = dictLowest + (repMatch_1._4_4_ - curr);
        }
        else {
          local_488 = pBVar2 + repMatch_1._4_4_;
        }
        repMatchEnd_1 = local_488;
        if (2 < (uVar1 - 1) - repMatch_1._4_4_) {
          UVar5 = MEM_read32(local_488);
          UVar6 = MEM_read32(pBVar10);
          if (UVar5 == UVar6) {
            local_498 = iEnd;
            if (repMatch_1._4_4_ < uVar1) {
              local_498 = _dictAndPrefixLength;
            }
            mlRep_1 = (size_t)local_498;
            sVar9 = ZSTD_count_2segments(anchor + 5,repMatchEnd_1 + 4,iEnd,local_498,iStart);
            _gain1_1 = sVar9 + 4;
            offset2._4_4_ = (int)_gain1_1 * 3;
            iVar4 = (int)offset;
            UVar5 = ZSTD_highbit32((int)start + 1);
            offset2._0_4_ = (iVar4 * 3 - UVar5) + 1;
            if ((3 < _gain1_1) && ((int)offset2 < offset2._4_4_)) {
              offset = _gain1_1;
              start = (BYTE *)0x0;
              pBStack_2e0 = pBVar10;
            }
          }
        }
      }
      ml2_1 = 999999999;
      _gain1_2 = (*_offset_2)(ms,pBVar10,iEnd,&ml2_1);
      lVar11 = _gain1_2 << 2;
      UVar5 = ZSTD_highbit32((int)ml2_1 + 1);
      mlRep_2._4_4_ = (int)lVar11 - UVar5;
      lVar11 = offset << 2;
      UVar5 = ZSTD_highbit32((int)start + 1);
      mlRep_2._0_4_ = ((int)lVar11 - UVar5) + 4;
      if ((_gain1_2 < 4) || (mlRep_2._4_4_ <= (int)mlRep_2)) {
        if (pBVar8 <= pBVar10) break;
        pBVar10 = anchor + 2;
        if ((int)dms != 0) {
          repMatch_2._4_4_ = ((int)pBVar10 - iVar3) - savedOffset;
          if (repMatch_2._4_4_ < uVar1) {
            local_4c8 = dictLowest + (repMatch_2._4_4_ - curr);
          }
          else {
            local_4c8 = pBVar2 + repMatch_2._4_4_;
          }
          repMatchEnd_2 = local_4c8;
          if (2 < (uVar1 - 1) - repMatch_2._4_4_) {
            UVar5 = MEM_read32(local_4c8);
            UVar6 = MEM_read32(pBVar10);
            if (UVar5 == UVar6) {
              local_4d8 = iEnd;
              if (repMatch_2._4_4_ < uVar1) {
                local_4d8 = _dictAndPrefixLength;
              }
              mlRep_3 = (size_t)local_4d8;
              sVar9 = ZSTD_count_2segments(anchor + 6,repMatchEnd_2 + 4,iEnd,local_4d8,iStart);
              _gain1_4 = sVar9 + 4;
              offset2_1._4_4_ = (int)_gain1_4 * 4;
              lVar11 = offset << 2;
              UVar5 = ZSTD_highbit32((int)start + 1);
              offset2_1._0_4_ = ((int)lVar11 - UVar5) + 1;
              if ((3 < _gain1_4) && ((int)offset2_1 < offset2_1._4_4_)) {
                offset = _gain1_4;
                start = (BYTE *)0x0;
                pBStack_2e0 = pBVar10;
              }
            }
          }
        }
        ml2_2 = 999999999;
        sVar9 = (*_offset_2)(ms,pBVar10,iEnd,&ml2_2);
        UVar5 = ZSTD_highbit32((int)ml2_2 + 1);
        lVar11 = offset << 2;
        UVar6 = ZSTD_highbit32((int)start + 1);
        if ((sVar9 < 4) || ((int)((int)(sVar9 << 2) - UVar5) <= (int)(((int)lVar11 - UVar6) + 7)))
        break;
        start = (BYTE *)ml2_2;
        pBStack_2e0 = pBVar10;
        offset = sVar9;
        anchor = pBVar10;
      }
      else {
        start = (BYTE *)ml2_1;
        pBStack_2e0 = pBVar10;
        offset = _gain1_2;
        anchor = pBVar10;
      }
    }
    iVar4 = (int)start;
    if (start != (BYTE *)0x0) {
      if ((int)dms != 0) {
        uVar7 = ((int)pBStack_2e0 - iVar3) - (iVar4 + -2);
        if (uVar7 < uVar1) {
          local_500 = dictLowest + ((ulong)uVar7 - (ulong)curr);
        }
        else {
          local_500 = pBVar2 + uVar7;
        }
        mStart = local_500;
        local_508 = iStart;
        if (uVar7 < uVar1) {
          local_508 = dictEnd;
        }
        while( true ) {
          bVar14 = false;
          if ((iend < pBStack_2e0) && (bVar14 = false, local_508 < mStart)) {
            bVar14 = pBStack_2e0[-1] == mStart[-1];
          }
          if (!bVar14) break;
          pBStack_2e0 = pBStack_2e0 + -1;
          mStart = mStart + -1;
          offset = offset + 1;
        }
      }
      isDMS = savedOffset;
      savedOffset = iVar4 - 2;
    }
    uVar12 = (long)pBStack_2e0 - (long)iend;
    uVar13 = offset - 3;
    if (iEnd + -0x20 < iend + uVar12) {
      ZSTD_safecopyLiterals(seqStore->lit,iend,iend + uVar12,iEnd + -0x20);
    }
    else {
      ZSTD_copy16(seqStore->lit,iend);
      if (0x10 < uVar12) {
        pBVar10 = seqStore->lit;
        dst = pBVar10 + 0x10;
        ZSTD_copy16(dst,iend + 0x10);
        if (0x10 < (long)(uVar12 - 0x10)) {
          oend = pBVar10 + 0x20;
          do {
            op = iend + 0x20;
            ZSTD_copy16(oend,op);
            ZSTD_copy16(oend + 0x10,iend + 0x30);
            oend = oend + 0x20;
            iend = op;
          } while (oend < dst + (uVar12 - 0x10));
        }
      }
    }
    seqStore->lit = seqStore->lit + uVar12;
    if (0xffff < uVar12) {
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos =
           (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
    }
    seqStore->sequences->litLength = (U16)uVar12;
    seqStore->sequences->offset = iVar4 + 1;
    if (0xffff < uVar13) {
      seqStore->longLengthType = ZSTD_llt_matchLength;
      seqStore->longLengthPos =
           (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
    }
    seqStore->sequences->matchLength = (U16)uVar13;
    seqStore->sequences = seqStore->sequences + 1;
    anchor = pBStack_2e0 + offset;
    if ((int)dms != 0) {
      for (; anchor <= pBVar8; anchor = anchor + offset) {
        uVar7 = ((int)anchor - iVar3) - isDMS;
        if (uVar7 < uVar1) {
          local_518 = dictLowest + ((ulong)uVar7 - (ulong)curr);
        }
        else {
          local_518 = pBVar2 + uVar7;
        }
        if ((uVar1 - 1) - uVar7 < 3) break;
        UVar5 = MEM_read32(local_518);
        UVar6 = MEM_read32(anchor);
        if (UVar5 != UVar6) break;
        local_528 = iEnd;
        if (uVar7 < uVar1) {
          local_528 = _dictAndPrefixLength;
        }
        sVar9 = ZSTD_count_2segments(anchor + 4,local_518 + 4,iEnd,local_528,iStart);
        iVar4 = isDMS;
        offset = sVar9 + 4;
        start = (BYTE *)(ulong)(uint)isDMS;
        isDMS = savedOffset;
        savedOffset = iVar4;
        if (iEnd + -0x20 < anchor) {
          ZSTD_safecopyLiterals(seqStore->lit,anchor,anchor,iEnd + -0x20);
        }
        else {
          ZSTD_copy16(seqStore->lit,anchor);
        }
        seqStore->lit = seqStore->lit;
        seqStore->sequences->litLength = 0;
        seqStore->sequences->offset = 1;
        if (0xffff < sVar9 + 1) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->matchLength = (U16)(sVar9 + 1);
        seqStore->sequences = seqStore->sequences + 1;
      }
    }
    iend = anchor;
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_lazy2_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 2, ZSTD_dictMatchState);
}